

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_ons_ons_cloud_get_appkey_list.cc
# Opt level: O2

int __thiscall
aliyun::Ons::OnsCloudGetAppkeyList
          (Ons *this,OnsOnsCloudGetAppkeyListRequestType *req,
          OnsOnsCloudGetAppkeyListResponseType *response,OnsErrorInfo *error_info)

{
  bool bVar1;
  int iVar2;
  Int IVar3;
  AliRpcRequest *this_00;
  Value *pVVar4;
  Value *pVVar5;
  char *pcVar6;
  allocator<char> local_3dc;
  allocator<char> local_3db;
  allocator<char> local_3da;
  allocator<char> local_3d9;
  string local_3d8;
  Value val;
  string str_response;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string secheme;
  Reader reader;
  
  str_response._M_dataplus._M_p = (pointer)&str_response.field_2;
  str_response._M_string_length = 0;
  str_response.field_2._M_local_buf[0] = '\0';
  pcVar6 = "http";
  if (this->use_tls_ != false) {
    pcVar6 = "https";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&secheme,pcVar6,(allocator<char> *)&reader);
  this_00 = (AliRpcRequest *)operator_new(0x2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,this->version_,(allocator<char> *)&local_3d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,this->appid_,(allocator<char> *)&val);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,this->secret_,&local_3dc);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 &secheme,"://");
  std::operator+(&local_1e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 this->host_);
  AliRpcRequest::AliRpcRequest(this_00,&local_180,&local_1a0,&local_1c0,&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&reader);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_180);
  if (((this->use_tls_ == false) && (pcVar6 = this->proxy_host_, pcVar6 != (char *)0x0)) &&
     (*pcVar6 != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_200,pcVar6,(allocator<char> *)&reader);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)this_00,&local_200);
    std::__cxx11::string::~string((string *)&local_200);
  }
  Json::Value::Value(&val,nullValue);
  Json::Reader::Reader(&reader);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"Action",(allocator<char> *)&local_3d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_240,"OnsCloudGetAppkeyList",&local_3dc);
  AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_220,&local_240);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_220);
  if ((req->ons_region_id)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_260,"OnsRegionId",(allocator<char> *)&local_3d8);
    std::__cxx11::string::string((string *)&local_280,(string *)req);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_260,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_260);
  }
  if ((req->ons_platform)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a0,"OnsPlatform",(allocator<char> *)&local_3d8);
    std::__cxx11::string::string((string *)&local_2c0,(string *)&req->ons_platform);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2a0,&local_2c0);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::~string((string *)&local_2a0);
  }
  if ((req->prevent_cache)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e0,"PreventCache",(allocator<char> *)&local_3d8);
    std::__cxx11::string::string((string *)&local_300,(string *)&req->prevent_cache);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2e0,&local_300);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::~string((string *)&local_2e0);
  }
  if ((req->isv_id)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_320,"IsvId",(allocator<char> *)&local_3d8);
    std::__cxx11::string::string((string *)&local_340,(string *)&req->isv_id);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_320,&local_340);
    std::__cxx11::string::~string((string *)&local_340);
    std::__cxx11::string::~string((string *)&local_320);
  }
  if ((this->region_id_ != (char *)0x0) && (*this->region_id_ != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_360,"RegionId",(allocator<char> *)&local_3d8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_380,this->region_id_,&local_3dc);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_360,&local_380);
    std::__cxx11::string::~string((string *)&local_380);
    std::__cxx11::string::~string((string *)&local_360);
  }
  iVar2 = (**(this_00->super_AliHttpRequest)._vptr_AliHttpRequest)(this_00);
  if (iVar2 == 0) {
    iVar2 = AliHttpRequest::WaitResponseHeaderComplete((AliHttpRequest *)this_00);
    AliHttpRequest::ReadResponseBody((AliHttpRequest *)this_00,&str_response);
    if (((0 < iVar2) && (str_response._M_string_length != 0)) &&
       (bVar1 = Json::Reader::parse(&reader,&str_response,&val,true), bVar1)) {
      if (error_info != (OnsErrorInfo *)0x0 && iVar2 != 200) {
        bVar1 = Json::Value::isMember(&val,"RequestId");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"RequestId");
          Json::Value::asString_abi_cxx11_(&local_3d8,pVVar4);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3d8,anon_var_dwarf_1ba8e0 + 9,&local_3dc);
        }
        std::__cxx11::string::operator=((string *)error_info,(string *)&local_3d8);
        std::__cxx11::string::~string((string *)&local_3d8);
        bVar1 = Json::Value::isMember(&val,"Code");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"Code");
          Json::Value::asString_abi_cxx11_(&local_3d8,pVVar4);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3d8,anon_var_dwarf_1ba8e0 + 9,&local_3d9);
        }
        std::__cxx11::string::operator=((string *)&error_info->code,(string *)&local_3d8);
        std::__cxx11::string::~string((string *)&local_3d8);
        bVar1 = Json::Value::isMember(&val,"HostId");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"HostId");
          Json::Value::asString_abi_cxx11_(&local_3d8,pVVar4);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3d8,anon_var_dwarf_1ba8e0 + 9,&local_3da);
        }
        std::__cxx11::string::operator=((string *)&error_info->host_id,(string *)&local_3d8);
        std::__cxx11::string::~string((string *)&local_3d8);
        bVar1 = Json::Value::isMember(&val,"Message");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"Message");
          Json::Value::asString_abi_cxx11_(&local_3d8,pVVar4);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3d8,anon_var_dwarf_1ba8e0 + 9,&local_3db);
        }
        std::__cxx11::string::operator=((string *)&error_info->message,(string *)&local_3d8);
        std::__cxx11::string::~string((string *)&local_3d8);
      }
      if (response != (OnsOnsCloudGetAppkeyListResponseType *)0x0 && iVar2 == 200) {
        bVar1 = Json::Value::isMember(&val,"HelpUrl");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"HelpUrl");
          Json::Value::asString_abi_cxx11_(&local_3d8,pVVar4);
          std::__cxx11::string::operator=((string *)&response->help_url,(string *)&local_3d8);
          std::__cxx11::string::~string((string *)&local_3d8);
        }
        bVar1 = Json::Value::isMember(&val,"Data");
        iVar2 = 200;
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"Data");
          bVar1 = Json::Value::isMember(pVVar4,"AppStatus");
          if (bVar1) {
            pVVar5 = Json::Value::operator[](pVVar4,"AppStatus");
            IVar3 = Json::Value::asInt(pVVar5);
            (response->data).app_status = (long)IVar3;
          }
          bVar1 = Json::Value::isMember(pVVar4,"Appkey");
          if (bVar1) {
            pVVar5 = Json::Value::operator[](pVVar4,"Appkey");
            Json::Value::asString_abi_cxx11_(&local_3d8,pVVar5);
            std::__cxx11::string::operator=((string *)&(response->data).appkey,(string *)&local_3d8)
            ;
            std::__cxx11::string::~string((string *)&local_3d8);
          }
          bVar1 = Json::Value::isMember(pVVar4,"Description");
          if (bVar1) {
            pVVar5 = Json::Value::operator[](pVVar4,"Description");
            Json::Value::asString_abi_cxx11_(&local_3d8,pVVar5);
            std::__cxx11::string::operator=
                      ((string *)&(response->data).description,(string *)&local_3d8);
            std::__cxx11::string::~string((string *)&local_3d8);
          }
          bVar1 = Json::Value::isMember(pVVar4,"IsvId");
          if (bVar1) {
            pVVar5 = Json::Value::operator[](pVVar4,"IsvId");
            IVar3 = Json::Value::asInt(pVVar5);
            (response->data).isv_id = (long)IVar3;
          }
          bVar1 = Json::Value::isMember(pVVar4,"SupportEmail");
          if (bVar1) {
            pVVar5 = Json::Value::operator[](pVVar4,"SupportEmail");
            Json::Value::asString_abi_cxx11_(&local_3d8,pVVar5);
            std::__cxx11::string::operator=
                      ((string *)&(response->data).support_email,(string *)&local_3d8);
            std::__cxx11::string::~string((string *)&local_3d8);
          }
          bVar1 = Json::Value::isMember(pVVar4,"Title");
          if (bVar1) {
            pVVar5 = Json::Value::operator[](pVVar4,"Title");
            Json::Value::asString_abi_cxx11_(&local_3d8,pVVar5);
            std::__cxx11::string::operator=((string *)&(response->data).title,(string *)&local_3d8);
            std::__cxx11::string::~string((string *)&local_3d8);
          }
          bVar1 = Json::Value::isMember(pVVar4,"Wangwang");
          if (bVar1) {
            pVVar4 = Json::Value::operator[](pVVar4,"Wangwang");
            Json::Value::asString_abi_cxx11_(&local_3d8,pVVar4);
            std::__cxx11::string::operator=
                      ((string *)&(response->data).wangwang,(string *)&local_3d8);
            std::__cxx11::string::~string((string *)&local_3d8);
          }
        }
      }
      goto LAB_0013f27e;
    }
  }
  iVar2 = -1;
  if (error_info != (OnsErrorInfo *)0x0) {
    std::__cxx11::string::assign((char *)&error_info->code);
  }
LAB_0013f27e:
  AliRpcRequest::~AliRpcRequest(this_00);
  operator_delete(this_00,0x2c8);
  Json::Reader::~Reader(&reader);
  Json::Value::~Value(&val);
  std::__cxx11::string::~string((string *)&secheme);
  std::__cxx11::string::~string((string *)&str_response);
  return iVar2;
}

Assistant:

int Ons::OnsCloudGetAppkeyList(const OnsOnsCloudGetAppkeyListRequestType& req,
                      OnsOnsCloudGetAppkeyListResponseType* response,
                       OnsErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  std::string secheme = this->use_tls_ ? "https" : "http";
  AliRpcRequest* req_rpc = new AliRpcRequest(version_,
                         appid_,
                         secret_,
                         secheme + "://" + host_);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  Json::Value val;
  Json::Reader reader;
  req_rpc->AddRequestQuery("Action","OnsCloudGetAppkeyList");
  if(!req.ons_region_id.empty()) {
    req_rpc->AddRequestQuery("OnsRegionId", req.ons_region_id);
  }
  if(!req.ons_platform.empty()) {
    req_rpc->AddRequestQuery("OnsPlatform", req.ons_platform);
  }
  if(!req.prevent_cache.empty()) {
    req_rpc->AddRequestQuery("PreventCache", req.prevent_cache);
  }
  if(!req.isv_id.empty()) {
    req_rpc->AddRequestQuery("IsvId", req.isv_id);
  }
  if(this->region_id_ && this->region_id_[0]) {
    req_rpc->AddRequestQuery("RegionId", this->region_id_);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info && parse_success) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}